

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall mocker::Lexer::punct(Lexer *this,string *curTok)

{
  char cVar1;
  char *pcVar2;
  TokenID TVar3;
  LexError *this_00;
  TokenID id;
  bool bVar4;
  anon_class_8_1_8991fb9c add;
  
  pcVar2 = (curTok->_M_dataplus)._M_p;
  cVar1 = *pcVar2;
  add.this = this;
  switch(cVar1) {
  case '!':
    id = (uint)(curTok->_M_string_length == 1) * 3 + NotEqual;
    break;
  case '\"':
  case '#':
  case '$':
  case '\'':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case ':':
switchD_0016d741_caseD_22:
    this_00 = (LexError *)__cxa_allocate_exception(0x48);
    LexError::LexError(this_00,this->curPos,this->nxtPos);
    __cxa_throw(this_00,&LexError::typeinfo,CompileError::~CompileError);
  case '%':
    id = Mod;
    break;
  case '&':
    id = (uint)(curTok->_M_string_length == 1) * 5 + LogicalAnd;
    break;
  case '(':
    id = LeftParen;
    break;
  case ')':
    id = RightParen;
    break;
  case '*':
    id = Mult;
    break;
  case '+':
    bVar4 = curTok->_M_string_length == 2;
    TVar3 = PlusPlus;
    id = Plus;
    goto LAB_0016d85b;
  case ',':
    id = Comma;
    break;
  case '-':
    bVar4 = curTok->_M_string_length == 2;
    TVar3 = MinusMinus;
    id = Minus;
    goto LAB_0016d85b;
  case '.':
    id = Dot;
    break;
  case '/':
    id = Divide;
    break;
  case ';':
    id = Semicolon;
    break;
  case '<':
    if (curTok->_M_string_length == 1) {
      id = LessThan;
    }
    else {
      id = (uint)(pcVar2[1] != '=') * 4 + LessEqual;
    }
    break;
  case '=':
    bVar4 = curTok->_M_string_length == 1;
    TVar3 = Assign;
    id = Equal;
    goto LAB_0016d85b;
  case '>':
    if (curTok->_M_string_length == 1) {
      id = GreaterThan;
      break;
    }
    bVar4 = pcVar2[1] == '=';
    TVar3 = GreaterEqual;
    id = RightShift;
LAB_0016d85b:
    if (bVar4) {
      id = TVar3;
    }
    break;
  default:
    switch(cVar1) {
    case '{':
      id = LeftBrace;
      break;
    case '|':
      id = (uint)(curTok->_M_string_length == 1) * 5 + LogicalOr;
      break;
    case '}':
      id = RightBrace;
      break;
    case '~':
      id = BitNot;
      break;
    default:
      if (cVar1 == '[') {
        id = LeftBracket;
      }
      else if (cVar1 == ']') {
        id = RightBracket;
      }
      else {
        if (cVar1 != '^') goto switchD_0016d741_caseD_22;
        id = BitXor;
      }
    }
  }
  punct::anon_class_8_1_8991fb9c::operator()(&add,id);
  return;
}

Assistant:

void Lexer::punct(const std::string &curTok) {
  auto add = [this](TokenID id) { tokens.emplace_back(id, curPos, nxtPos); };
  switch (curTok[0]) {
  case '(':
    MOCKER_ADD(TokenID::LeftParen);
  case ')':
    MOCKER_ADD(TokenID::RightParen);
  case '[':
    MOCKER_ADD(TokenID::LeftBracket);
  case ']':
    MOCKER_ADD(TokenID::RightBracket);
  case '{':
    MOCKER_ADD(TokenID::LeftBrace);
  case '}':
    MOCKER_ADD(TokenID::RightBrace);
  case ';':
    MOCKER_ADD(TokenID::Semicolon);
  case ',':
    MOCKER_ADD(TokenID::Comma);
  case '+':
    add(curTok.size() == 2 ? TokenID::PlusPlus : TokenID::Plus);
    break;
  case '-':
    add(curTok.size() == 2 ? TokenID::MinusMinus : TokenID::Minus);
    break;
  case '*':
    MOCKER_ADD(TokenID::Mult);
  case '/':
    MOCKER_ADD(TokenID::Divide);
  case '%':
    MOCKER_ADD(TokenID::Mod);
  case '>':
    if (curTok.size() == 1) {
      add(TokenID::GreaterThan);
      break;
    }
    add(curTok[1] == '=' ? TokenID::GreaterEqual : TokenID::RightShift);
    break;
  case '<':
    if (curTok.size() == 1) {
      add(TokenID::LessThan);
      break;
    }
    add(curTok[1] == '=' ? TokenID::LessEqual : TokenID::LeftShift);
    break;
  case '=':
    add(curTok.size() == 1 ? TokenID::Assign : TokenID::Equal);
    break;
  case '!':
    add(curTok.size() == 1 ? TokenID::LogicalNot : TokenID::NotEqual);
    break;
  case '&':
    add(curTok.size() == 1 ? TokenID::BitAnd : TokenID::LogicalAnd);
    break;
  case '|':
    add(curTok.size() == 1 ? TokenID::BitOr : TokenID::LogicalOr);
    break;
  case '~':
    MOCKER_ADD(TokenID::BitNot);
  case '^':
    MOCKER_ADD(TokenID::BitXor);
  case '.':
    MOCKER_ADD(TokenID::Dot);
  default:
    throw LexError(curPos, nxtPos);
  }
}